

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * join(string *__return_storage_ptr__,string *separator,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *items)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_1b4;
  uint i;
  size_type size;
  stringstream s;
  ostream local_198 [376];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *items_local;
  string *separator_local;
  
  local_20 = items;
  items_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)separator;
  separator_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&size);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  for (local_1b4 = 0; local_1b4 < sVar1; local_1b4 = local_1b4 + 1) {
    if (local_1b4 != 0) {
      std::operator<<(local_198,(string *)items_local);
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,(ulong)local_1b4);
    std::operator<<(local_198,(string *)pvVar2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&size);
  return __return_storage_ptr__;
}

Assistant:

std::string join (
  const std::string& separator,
  const std::vector<std::string>& items)
{
  std::stringstream s;
  auto size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    if (i)
      s << separator;

    s << items[i];
  }

  return s.str ();
}